

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprUnmapAndDelete(Parse *pParse,Expr *p)

{
  sqlite3 *in_RSI;
  Parse *in_RDI;
  Expr *in_stack_ffffffffffffffe8;
  
  if (in_RSI != (sqlite3 *)0x0) {
    if (1 < in_RDI->eParseMode) {
      sqlite3RenameExprUnmap(in_RDI,(Expr *)in_RSI);
    }
    sqlite3ExprDeleteNN(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprUnmapAndDelete(Parse *pParse, Expr *p){
  if( p ){
    if( IN_RENAME_OBJECT ){
      sqlite3RenameExprUnmap(pParse, p);
    }
    sqlite3ExprDeleteNN(pParse->db, p);
  }
}